

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool find_space(loc_conflict *centre,wchar_t height,wchar_t width)

{
  wchar_t wVar1;
  loc *plVar2;
  ulong uVar3;
  dun_data *pdVar4;
  _Bool _Var5;
  wchar_t by1;
  wchar_t bx1;
  wchar_t by2;
  int iVar6;
  wchar_t bx2;
  uint uVar8;
  long lVar9;
  int iVar7;
  
  iVar6 = (height + L'\xffffffff') / dun->block_hgt;
  uVar3 = (long)(width + L'\xffffffff') / (long)dun->block_wid;
  by1 = Rand_div(dun->row_blocks);
  bx1 = Rand_div(dun->col_blocks);
  by2 = iVar6 + by1;
  iVar7 = (int)uVar3;
  bx2 = iVar7 + bx1;
  _Var5 = check_for_unreserved_blocks(by1,bx1,by2,bx2);
  if (_Var5) {
    _Var5 = true;
  }
  else {
    uVar8 = 0;
    do {
      if (uVar8 == 0xffffffe8) {
        return false;
      }
      by1 = Rand_div(dun->row_blocks);
      bx1 = Rand_div(dun->col_blocks);
      by2 = iVar6 + by1;
      bx2 = bx1 + iVar7;
      _Var5 = check_for_unreserved_blocks(by1,bx1,by2,bx2);
      uVar8 = uVar8 - 1;
    } while (!_Var5);
    _Var5 = 0xffffffe7 < uVar8;
  }
  pdVar4 = dun;
  centre->y = ((by2 + by1 + 1) * dun->block_hgt) / 2;
  centre->x = ((bx1 + bx2 + 1) * pdVar4->block_wid) / 2;
  wVar1 = pdVar4->cent_n;
  if (wVar1 < (int)(uint)z_info->level_room_max) {
    plVar2 = pdVar4->cent;
    iVar6 = centre->y;
    plVar2[wVar1].x = centre->x;
    plVar2[wVar1].y = iVar6;
    dun->cent_n = dun->cent_n + L'\x01';
  }
  pdVar4 = dun;
  if (by1 <= by2) {
    lVar9 = (long)by1;
    iVar6 = (by2 - by1) + 1;
    do {
      if (bx1 <= bx2) {
        memset(pdVar4->room_map[lVar9] + bx1,1,(uVar3 & 0xffffffff) + 1);
      }
      lVar9 = lVar9 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return _Var5;
}

Assistant:

static bool find_space(struct loc *centre, int height, int width)
{
	int i;
	int by1, bx1, by2, bx2;

	/* Find out how many blocks we need. */
	int blocks_high = 1 + ((height - 1) / dun->block_hgt);
	int blocks_wide = 1 + ((width - 1) / dun->block_wid);

	/* We'll allow twenty-five guesses. */
	for (i = 0; i < 25; i++) {
		/* Pick a top left block at random */
		by1 = randint0(dun->row_blocks);
		bx1 = randint0(dun->col_blocks);

		/* Extract bottom right corner block */
		by2 = by1 + blocks_high - 1;
		bx2 = bx1 + blocks_wide - 1;

		if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) continue;

		/* Get the location of the room */
		centre->y = ((by1 + by2 + 1) * dun->block_hgt) / 2;
		centre->x = ((bx1 + bx2 + 1) * dun->block_wid) / 2;

		/* Save the room location */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = *centre;
			dun->cent_n++;
		}

		reserve_blocks(by1, bx1, by2, bx2);

		/* Success. */
		return (true);
	}

	/* Failure. */
	return (false);
}